

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O0

void __thiscall
rtosc::ThreadLink::writeArray(ThreadLink *this,char *dest,char *args,rtosc_arg_t *aargs)

{
  ringbuffer_t *ring;
  ringbuffer_t *prVar1;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  size_t len;
  char *in_stack_00000038;
  size_t in_stack_00000040;
  char *in_stack_00000048;
  
  ring = (ringbuffer_t *)
         rtosc_amessage(in_stack_00000048,in_stack_00000040,in_stack_00000038,(char *)this,
                        (rtosc_arg_t *)dest);
  prVar1 = (ringbuffer_t *)ring_write_size(ring);
  if (ring <= prVar1) {
    ring_write((ringbuffer_t *)len,in_stack_00000008,unaff_retaddr);
  }
  return;
}

Assistant:

void ThreadLink::writeArray(const char *dest, const char *args, const rtosc_arg_t *aargs)
{
    const size_t len =
        rtosc_amessage(write_buffer, MaxMsg, dest, args, aargs);
    if(ring_write_size(ring) >= len)
        ring_write(ring,write_buffer,len);
}